

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::printUnpackedArrayDim(TypePrinter *this,Type *type)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  format_string<const_unsigned_int_&> fmt;
  AssociativeArrayType *pAVar1;
  pointer pFVar2;
  QueueType *pQVar3;
  uint *args;
  TypePrinter *in_RSI;
  QueueType *at_2;
  AssociativeArrayType *at_1;
  FixedSizeUnpackedArrayType *at;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000570;
  TypePrinter *in_stack_00000578;
  Symbol *in_stack_00000580;
  size_t in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  Type *in_stack_ffffffffffffff28;
  FormatBuffer *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  FormatBuffer *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  FormatBuffer *in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  FixedSizeUnpackedArrayType *in_stack_ffffffffffffffe8;
  
  args = (uint *)(ulong)(*(int *)&in_RSI->options - 0xd);
  switch(args) {
  case (uint *)0x0:
    in_stack_ffffffffffffffe8 =
         Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x13d0b73);
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0x13d0b89);
    FormatBuffer::format<int_const&,int_const&>
              (in_stack_ffffffffffffff78,
               (format_string<const_int_&,_const_int_&>)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case (uint *)0x1:
  case (uint *)0x2:
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0x13d0beb);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
               (char *)in_stack_ffffffffffffff28);
    str._M_str = (char *)pFVar2;
    str._M_len = in_stack_ffffffffffffff38;
    FormatBuffer::append(in_stack_ffffffffffffff30,str);
    break;
  case (uint *)0x3:
    pAVar1 = Symbol::as<slang::ast::AssociativeArrayType>((Symbol *)0x13d0c30);
    if (pAVar1->indexType == (Type *)0x0) {
      pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                           *)0x13d0c55);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
                 (char *)in_stack_ffffffffffffff28);
      str_00._M_str = in_stack_ffffffffffffff40;
      str_00._M_len = (size_t)pFVar2;
      FormatBuffer::append(in_stack_ffffffffffffff30,str_00);
    }
    else {
      in_stack_ffffffffffffff20 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0x13d0c9b);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
                 (char *)in_stack_ffffffffffffff28);
      str_01._M_str = in_stack_ffffffffffffff40;
      str_01._M_len = in_stack_ffffffffffffff38;
      FormatBuffer::append(in_stack_ffffffffffffff30,str_01);
      in_stack_ffffffffffffff28 = pAVar1->indexType;
      ::sv((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_00000580,in_stack_00000578,in_stack_00000570);
      pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                           *)0x13d0d1e);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)pFVar2,
                 (char *)in_stack_ffffffffffffff28);
      str_02._M_str = in_stack_ffffffffffffff40;
      str_02._M_len = in_stack_ffffffffffffff38;
      FormatBuffer::append(pFVar2,str_02);
    }
    break;
  case (uint *)0x4:
    pQVar3 = Symbol::as<slang::ast::QueueType>((Symbol *)0x13d0d5a);
    if (pQVar3->maxBound == 0) {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0x13d0db8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30,
                 (char *)in_stack_ffffffffffffff28);
      str_03._M_str = in_stack_ffffffffffffff40;
      str_03._M_len = in_stack_ffffffffffffff38;
      FormatBuffer::append(in_stack_ffffffffffffff30,str_03);
    }
    else {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0x13d0d78);
      fmt.str.size_ = (size_t)"[$:{}]";
      fmt.str.data_ = in_stack_ffffffffffffff60;
      FormatBuffer::format<unsigned_int_const&>(in_stack_ffffffffffffff58,fmt,args);
    }
    break;
  default:
    goto switchD_013d0b64_default;
  }
  Type::getArrayElementType(in_stack_ffffffffffffff28);
  Type::getCanonicalType((Type *)in_stack_ffffffffffffff20);
  printUnpackedArrayDim(in_RSI,&in_stack_ffffffffffffffe8->super_Type);
switchD_013d0b64_default:
  return;
}

Assistant:

void TypePrinter::printUnpackedArrayDim(const Type& type) {
    switch (type.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType: {
            auto& at = type.as<FixedSizeUnpackedArrayType>();
            buffer->format("[{}:{}]", at.range.left, at.range.right);
            break;
        }
        case SymbolKind::DynamicArrayType:
        case SymbolKind::DPIOpenArrayType:
            buffer->append("[]");
            break;
        case SymbolKind::AssociativeArrayType: {
            auto& at = type.as<AssociativeArrayType>();
            if (!at.indexType) {
                buffer->append("[*]");
            }
            else {
                buffer->append("[");
                at.indexType->visit(*this, ""sv);
                buffer->append("]");
            }
            break;
        }
        case SymbolKind::QueueType: {
            auto& at = type.as<QueueType>();
            if (at.maxBound)
                buffer->format("[$:{}]", at.maxBound);
            else
                buffer->append("[$]");
            break;
        }
        default:
            return;
    }

    // We can only reach this if we know we have an array type.
    printUnpackedArrayDim(type.getArrayElementType()->getCanonicalType());
}